

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render-data.cc
# Opt level: O2

bool __thiscall
tinyusdz::tydra::RenderSceneConverter::BuildNodeHierarchy
          (RenderSceneConverter *this,RenderSceneConverterEnv *env,XformNode *root)

{
  pointer pXVar1;
  __type _Var2;
  XformNode *rootNode;
  pointer node;
  string defaultRootNode;
  Node root_node;
  allocator local_221;
  RenderSceneConverterEnv *local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  Node local_1d8;
  
  local_220 = env;
  ::std::__cxx11::string::string
            ((string *)&local_218,(string *)&(env->stage->stage_metas).defaultPrim);
  this->default_node = -1;
  pXVar1 = (root->children).
           super__Vector_base<tinyusdz::tydra::XformNode,_std::allocator<tinyusdz::tydra::XformNode>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (node = (root->children).
              super__Vector_base<tinyusdz::tydra::XformNode,_std::allocator<tinyusdz::tydra::XformNode>_>
              ._M_impl.super__Vector_impl_data._M_start; node != pXVar1; node = node + 1) {
    Node::Node(&local_1d8);
    ::std::__cxx11::string::string((string *)&local_1f8,"",&local_221);
    BuildNodeHierarchyImpl(this,local_220,(string *)&local_1f8,node,&local_1d8);
    ::std::__cxx11::string::_M_dispose();
    _Var2 = ::std::operator==(&local_218,&node->element_name);
    if (_Var2) {
      this->default_node =
           (int)(((long)(this->root_nodes).
                        super__Vector_base<tinyusdz::tydra::Node,_std::allocator<tinyusdz::tydra::Node>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->root_nodes).
                       super__Vector_base<tinyusdz::tydra::Node,_std::allocator<tinyusdz::tydra::Node>_>
                       ._M_impl.super__Vector_impl_data._M_start) / 0x1a8);
    }
    ::std::operator+(&local_1f8,"/",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)node);
    StringAndIdMap::add(&this->root_nodeMap,(string *)&local_1f8,
                        ((long)(this->root_nodes).
                               super__Vector_base<tinyusdz::tydra::Node,_std::allocator<tinyusdz::tydra::Node>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->root_nodes).
                              super__Vector_base<tinyusdz::tydra::Node,_std::allocator<tinyusdz::tydra::Node>_>
                              ._M_impl.super__Vector_impl_data._M_start) / 0x1a8);
    ::std::__cxx11::string::_M_dispose();
    ::std::vector<tinyusdz::tydra::Node,_std::allocator<tinyusdz::tydra::Node>_>::push_back
              (&this->root_nodes,&local_1d8);
    Node::~Node(&local_1d8);
  }
  ::std::__cxx11::string::_M_dispose();
  return true;
}

Assistant:

bool RenderSceneConverter::BuildNodeHierarchy(
    const RenderSceneConverterEnv &env, const XformNode &root) {
  std::string defaultRootNode = env.stage.metas().defaultPrim.str();

  default_node = -1;

  for (const auto &rootNode : root.children) {
    Node root_node;
    if (!BuildNodeHierarchyImpl(env, /* root */ "", rootNode, root_node)) {
      return false;
    }

    if (defaultRootNode == rootNode.element_name) {
      default_node = int(root_nodes.size());
    }

    root_nodeMap.add("/" + rootNode.element_name, root_nodes.size());
    root_nodes.push_back(root_node);
  }

  return true;
}